

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::DecodeCompressed(S2Loop *this,Decoder *decoder,int snap_level)

{
  undefined1 auVar1 [16];
  bool bVar2;
  S2Point *__s;
  ulong uVar3;
  ulong uVar4;
  Span<Vector3<double>_> points;
  uint32 unsigned_num_vertices;
  uint32 unsigned_depth;
  uint32 properties_uint32;
  bitset<2UL> properties;
  S2LatLngRect local_58;
  
  bVar2 = Decoder::get_varint32(decoder,&unsigned_num_vertices);
  if ((bVar2) && (unsigned_num_vertices - 1 < (uint)FLAGS_s2polygon_decode_max_num_vertices)) {
    ClearIndex(this);
    if ((this->owns_vertices_ == true) && (this->vertices_ != (S2Point *)0x0)) {
      operator_delete__(this->vertices_);
    }
    this->num_vertices_ = unsigned_num_vertices;
    uVar4 = (ulong)(int)unsigned_num_vertices;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar3 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    __s = (S2Point *)operator_new__(uVar3);
    if (unsigned_num_vertices != 0) {
      uVar3 = uVar4 * 0x18 - 0x18;
      memset(__s,0,(uVar3 - uVar3 % 0x18) + 0x18);
    }
    this->vertices_ = __s;
    this->owns_vertices_ = true;
    points.len_ = uVar4;
    points.ptr_ = __s;
    bVar2 = S2DecodePointsCompressed(decoder,snap_level,points);
    if ((bVar2) && (bVar2 = Decoder::get_varint32(decoder,&properties_uint32), bVar2)) {
      properties.super__Base_bitset<1UL>._M_w._0_4_ = properties_uint32 & 3;
      properties.super__Base_bitset<1UL>._M_w._4_4_ = 0;
      bVar2 = std::bitset<2UL>::test(&properties,0);
      this->origin_inside_ = bVar2;
      bVar2 = Decoder::get_varint32(decoder,&unsigned_depth);
      if (!bVar2) {
        return false;
      }
      this->depth_ = unsigned_depth;
      bVar2 = std::bitset<2UL>::test(&properties,1);
      if (bVar2) {
        bVar2 = S2LatLngRect::Decode(&this->bound_,decoder);
        if (!bVar2) {
          return false;
        }
        S2LatLngRectBounder::ExpandForSubregions(&local_58,&this->bound_);
        (this->subregion_bound_).lng_.bounds_.c_[0] = local_58.lng_.bounds_.c_[0];
        (this->subregion_bound_).lng_.bounds_.c_[1] = local_58.lng_.bounds_.c_[1];
        (this->subregion_bound_).lat_.bounds_.c_[0] = local_58.lat_.bounds_.c_[0];
        (this->subregion_bound_).lat_.bounds_.c_[1] = local_58.lat_.bounds_.c_[1];
      }
      else {
        InitBound(this);
      }
      InitIndex(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool S2Loop::DecodeCompressed(Decoder* decoder, int snap_level) {
  // get_varint32 takes a uint32*, but num_vertices_ is signed.
  // Decode to a temporary variable to avoid reinterpret_cast.
  uint32 unsigned_num_vertices;
  if (!decoder->get_varint32(&unsigned_num_vertices)) {
    return false;
  }
  if (unsigned_num_vertices == 0 ||
      unsigned_num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = unsigned_num_vertices;
  vertices_ = new S2Point[num_vertices_];
  owns_vertices_ = true;

  if (!S2DecodePointsCompressed(decoder, snap_level,
                                MakeSpan(vertices_, num_vertices_))) {
    return false;
  }
  uint32 properties_uint32;
  if (!decoder->get_varint32(&properties_uint32)) {
    return false;
  }
  const std::bitset<kNumProperties> properties(properties_uint32);
  origin_inside_ = properties.test(kOriginInside);

  uint32 unsigned_depth;
  if (!decoder->get_varint32(&unsigned_depth)) {
    return false;
  }
  depth_ = unsigned_depth;

  if (properties.test(kBoundEncoded)) {
    if (!bound_.Decode(decoder)) {
      return false;
    }
    subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  } else {
    InitBound();
  }
  InitIndex();
  return true;
}